

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_base.c
# Opt level: O0

MPP_RET set_picbuf(void *hal)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  HalVp8ePicBuf *picbuf;
  RK_S32 height;
  RK_S32 width;
  RK_U32 i;
  HalVp8eCtx *ctx;
  void *hal_local;
  
  iVar1 = *(int *)((long)hal + 0x78) << 4;
  iVar2 = *(int *)((long)hal + 0x7c) << 4;
  memset((void *)((long)hal + 0x3660),0,0xe0);
  memset((void *)((long)hal + 0x3740),0,0xa8);
  for (height = 0; (uint)height < 4; height = height + 1) {
    *(int *)((long)hal + (ulong)(uint)height * 0x38 + 0x3660) = iVar1;
    *(int *)((long)hal + (ulong)(uint)height * 0x38 + 0x3664) = iVar2;
    *(int *)((long)hal + (ulong)(uint)height * 0x38 + 0x3668) = iVar1 / 2;
    *(int *)((long)hal + (ulong)(uint)height * 0x38 + 0x366c) = iVar2 / 2;
    *(undefined4 *)((long)hal + (ulong)(uint)height * 0x38 + 0x3670) = 0;
    *(undefined4 *)((long)hal + (ulong)(uint)height * 0x38 + 0x3674) = 0;
  }
  *(long *)((long)hal + 0x37e8) = (long)hal + 0x3660;
  *(undefined4 *)((long)hal + 0x120) = 1;
  pvVar3 = mpp_osal_calloc("set_picbuf",0x3c);
  *(void **)((long)hal + 0x118) = pvVar3;
  if (*(long *)((long)hal + 0x118) == 0) {
    _mpp_log_l(2,"hal_vp8e_base","failed to malloc ppss store.\n",(char *)0x0);
    hal_local._4_4_ = MPP_NOK;
  }
  else {
    *(undefined8 *)((long)hal + 0x128) = *(undefined8 *)((long)hal + 0x118);
    *(undefined1 *)(*(long *)((long)hal + 0x128) + 0x18) = 0;
    **(undefined1 **)((long)hal + 0x128) = 0;
    hal_local._4_4_ = MPP_OK;
  }
  return hal_local._4_4_;
}

Assistant:

static MPP_RET set_picbuf(void *hal)
{
    HalVp8eCtx *ctx = (HalVp8eCtx *)hal;

    // find one dpb for current picture
    {
        RK_U32 i = 0;
        RK_S32 width  = ctx->sps.pic_width_in_mbs * 16;
        RK_S32 height = ctx->sps.pic_height_in_mbs * 16;
        HalVp8ePicBuf *picbuf = &ctx->picbuf;

        memset(picbuf->ref_pic, 0, sizeof(picbuf->ref_pic));
        memset(picbuf->ref_pic_list, 0, sizeof(picbuf->ref_pic_list));

        for (i = 0; i < REF_FRAME_COUNT + 1; i++) {
            picbuf->ref_pic[i].picture.lum_width  = width;
            picbuf->ref_pic[i].picture.lum_height = height;
            picbuf->ref_pic[i].picture.ch_width   = width / 2;
            picbuf->ref_pic[i].picture.ch_height  = height / 2;
            picbuf->ref_pic[i].picture.lum = 0;
            picbuf->ref_pic[i].picture.cb  = 0;
        }

        picbuf->cur_pic = &picbuf->ref_pic[0];
    }

    ctx->ppss.size = 1;
    ctx->ppss.store = (Pps *)mpp_calloc(Pps, 1);
    if (ctx->ppss.store == NULL) {
        mpp_err("failed to malloc ppss store.\n");
        goto __ERR_RET;
    }

    ctx->ppss.pps = ctx->ppss.store;
    ctx->ppss.pps->segment_enabled  = 0;
    ctx->ppss.pps->sgm.map_modified = 0;

    return MPP_OK;

__ERR_RET:
    return MPP_NOK;
}